

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O3

int movemon(void)

{
  monst *pmVar1;
  monst *mtmp;
  boolean bVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  obj *poVar6;
  byte bVar7;
  byte bVar8;
  
  bVar7 = 0;
  pmVar1 = level->monlist;
  bVar8 = 0;
joined_r0x001e7112:
  do {
    while( true ) {
      do {
        do {
          mtmp = pmVar1;
          if (mtmp == (monst *)0x0) {
            bVar2 = any_light_source();
            if (bVar2 != '\0') {
              vision_full_recalc = '\x01';
            }
            dmonsfree(level);
            if (u.utotype != '\0') {
              deferred_goto();
              bVar8 = 0;
            }
            return (int)bVar8;
          }
          pmVar1 = mtmp->nmon;
        } while ((mtmp->mhp < 1) || (mtmp->movement < 0xc));
        uVar3 = mtmp->movement - 0xc;
        mtmp->movement = uVar3;
        if (0xb < uVar3) {
          bVar7 = 1;
        }
        if (vision_full_recalc != '\0') {
          vision_recalc(0);
        }
        iVar4 = minliquid(mtmp);
        bVar8 = bVar7;
      } while (iVar4 != 0);
      if ((mtmp->data->mflags1 & 0x100) == 0) goto LAB_001e71a4;
      if (((((*(ushort *)&mtmp->field_0x60 & 0x170) != 0) || (mtmp->m_ap_type != '\0')) ||
          ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0)) ||
         ((uVar5 = mt_random(), 0x55555555 < uVar5 * -0x55555555 || (u.ustuck == mtmp)))) break;
      if (((mtmp->data->mflags1 & 0x10000) == 0) &&
         ((poVar6 = which_armor(mtmp,4), poVar6 == (obj *)0x0 ||
          (poVar6 = which_armor(mtmp,4), poVar6->otyp != 0x4f)))) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001e72d9;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001e72d4;
LAB_001e735a:
          if ((u.uprops[0x19].extrinsic == 0) ||
             ((u.uprops[0x19].blocked != 0 ||
              (iVar4 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar4))))
          goto LAB_001e739a;
        }
        else {
LAB_001e72d4:
          if (ublindf != (obj *)0x0) {
LAB_001e72d9:
            if (ublindf->oartifact == '\x1d') goto LAB_001e735a;
          }
          if ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
               (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
               youmonst.data != mons + 0x32) || (u.uprops[0x19].blocked != 0)) goto LAB_001e735a;
        }
LAB_001e73c6:
        iVar4 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
        if (iVar4 < 3) break;
      }
      else {
LAB_001e739a:
        if ((u.uprops[0x42].intrinsic != 0) ||
           ((u.uprops[0x42].extrinsic != 0 || (bVar2 = match_warn_of_mon(mtmp), bVar2 != '\0'))))
        goto LAB_001e73c6;
      }
      if (mtmp->data->mlet == '\r') {
        set_mimic_sym(mtmp,level);
      }
      else {
        if (level->locations[mtmp->mx][mtmp->my].typ != '\x19') break;
        mtmp->field_0x60 = mtmp->field_0x60 | 0x80;
      }
    }
  } while (((byte)(mtmp->m_ap_type - 1) < 2) || ((mtmp->field_0x60 & 0x80) != 0));
LAB_001e71a4:
  if ((u.uprops[0x15].extrinsic != 0 || u.uprops[0x15].intrinsic != 0) &&
     ((*(uint *)&mtmp->field_0x60 & 0x20020000) == 0x20000)) {
    if (((viz_array[mtmp->my][mtmp->mx] & 1U) != 0) &&
       ((iVar4 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar4 < 0x41 &&
        (iVar4 = fightm(mtmp), iVar4 != 0)))) goto joined_r0x001e7112;
  }
  dochugw(mtmp);
  goto joined_r0x001e7112;
}

Assistant:

int movemon(void)
{
    struct monst *mtmp, *nmtmp;
    boolean somebody_can_move = FALSE;

    /*
    Some of you may remember the former assertion here that
    because of deaths and other actions, a simple one-pass
    algorithm wasn't possible for movemon.  Deaths are no longer
    removed to the separate list fdmon; they are simply left in
    the chain with hit points <= 0, to be cleaned up at the end
    of the pass.

    The only other actions which cause monsters to be removed from
    the chain are level migrations and losedogs().  I believe losedogs()
    is a cleanup routine not associated with monster movements, and
    monsters can only affect level migrations on themselves, not others
    (hence the fetching of nmon before moving the monster).  Currently,
    monsters can jump into traps, read cursed scrolls of teleportation,
    and drink cursed potions of raise level to change levels.  These are
    all reflexive at this point.  Should one monster be able to level
    teleport another, this scheme would have problems.
    */

    for (mtmp = level->monlist; mtmp; mtmp = nmtmp) {
	nmtmp = mtmp->nmon;

	/* Find a monster that we have not treated yet.	 */
	if (DEADMONSTER(mtmp))
	    continue;
	if (mtmp->movement < NORMAL_SPEED)
	    continue;

	mtmp->movement -= NORMAL_SPEED;
	if (mtmp->movement >= NORMAL_SPEED)
	    somebody_can_move = TRUE;

	if (vision_full_recalc) vision_recalc(0);	/* vision! */

	if (minliquid(mtmp)) continue;

	if (is_hider(mtmp->data)) {
	    /* unwatched mimics and piercers may hide again  [MRS] */
	    if (restrap(mtmp))   continue;
	    if (mtmp->m_ap_type == M_AP_FURNITURE ||
				mtmp->m_ap_type == M_AP_OBJECT)
		    continue;
	    if (mtmp->mundetected) continue;
	}

	/* continue if the monster died fighting */
	if (Conflict && !mtmp->iswiz && mtmp->mcansee) {
	    /* Note:
	     *  Conflict does not take effect in the first round.
	     *  Therefore, A monster when stepping into the area will
	     *  get to swing at you.
	     *
	     *  The call to fightm() must be _last_.  The monster might
	     *  have died if it returns 1.
	     */
	    if (couldsee(mtmp->mx,mtmp->my) &&
		(distu(mtmp->mx,mtmp->my) <= BOLT_LIM*BOLT_LIM) &&
							fightm(mtmp))
		continue;	/* mon might have died */
	}
	if (dochugw(mtmp))		/* otherwise just move the monster */
	    continue;
    }

    if (any_light_source())
	vision_full_recalc = 1;	/* in case a mon moved with a light source */
    dmonsfree(level);	/* remove all dead monsters */

    /* a monster may have levteleported player -dlc */
    if (u.utotype) {
	deferred_goto();
	/* changed levels, so these monsters are dormant */
	somebody_can_move = FALSE;
    }

    return somebody_can_move;
}